

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O0

void * OpenDataServerCommand::readFromServer(int *soket)

{
  bool bVar1;
  bool bVar2;
  DataBase *pDVar3;
  ssize_t sVar4;
  ulong uVar5;
  DataBase *pDVar6;
  string local_480;
  int local_45c;
  int local_458;
  int has_n2;
  int has_n;
  allocator local_441;
  string local_440 [8];
  string sim_line;
  char local_418 [4];
  int valread;
  char buffer [1024];
  int *soket_local;
  
  while( true ) {
    bVar1 = DataBase::getIsRunning(data);
    bVar2 = false;
    if (bVar1) {
      pDVar3 = DataBase::getInstance();
      bVar2 = pDVar3 != (DataBase *)0x0;
    }
    if (!bVar2) break;
    memset(local_418,0,0x400);
    sVar4 = read(*soket,local_418,0x400);
    sim_line.field_2._12_4_ = (undefined4)sVar4;
    uVar5 = (ulong)(int)sim_line.field_2._12_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,local_418,uVar5,&local_441);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    local_458 = std::__cxx11::string::find_first_of((char)local_440,10);
    local_45c = std::__cxx11::string::find_last_of((char)local_440,10);
    if ((((local_458 != -1) && (local_45c != -1)) &&
        (bVar2 = std::mutex::try_lock(&data->sim_var_map_lock), bVar2)) &&
       ((bVar2 = std::mutex::try_lock(&data->in_var_map_lock), bVar2 &&
        (pDVar6 = DataBase::getInstance(), pDVar3 = data, pDVar6 != (DataBase *)0x0)))) {
      std::__cxx11::string::string((string *)&local_480,local_440);
      DataBase::setSimData(pDVar3,&local_480);
      std::__cxx11::string::~string((string *)&local_480);
    }
    std::__cxx11::string::~string(local_440);
  }
  return (void *)0x0;
}

Assistant:

void *OpenDataServerCommand::readFromServer(int *soket) {
  //reading from client
  while (data->getIsRunning() && data->getInstance() != nullptr) {
    char buffer[1024] = {0};
    int valread = read(*soket, buffer, 1024);
    string sim_line(buffer, valread);
    // making sure it has 36 values between /n
    int has_n = sim_line.find_first_of('\n');
    int has_n2 = sim_line.find_last_of('\n');
    if (has_n != -1 && has_n2 != -1) {
      if (data->sim_var_map_lock.try_lock() && data->in_var_map_lock.try_lock()
          && data->getInstance() != nullptr) {
        data->setSimData(sim_line);
      }
    }
  }
  return nullptr;
}